

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

quint32 __thiscall QBitArray::toUInt32(QBitArray *this,Endian endianness,bool *ok)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  pcVar2 = (this->d).d.ptr;
  lVar8 = (this->d).d.size * 8;
  pcVar3 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar3 = &QByteArray::_empty;
  }
  cVar1 = *pcVar3;
  uVar7 = lVar8 - cVar1;
  if (0x20 < (long)uVar7) {
    if (ok != (bool *)0x0) {
      *ok = false;
    }
    return 0;
  }
  if (ok != (bool *)0x0) {
    *ok = true;
  }
  uVar4 = 0;
  if ((long)uVar7 < 1) {
    uVar7 = uVar4;
  }
  uVar6 = ~(long)cVar1 + lVar8;
  iVar5 = 1;
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    uVar11 = uVar6;
    if (endianness == ByteOrder) {
      uVar11 = uVar9;
    }
    iVar10 = 0;
    if (((byte)pcVar2[((long)uVar11 >> 3) + 1] >> ((uint)uVar11 & 7) & 1) != 0) {
      iVar10 = iVar5;
    }
    uVar4 = (ulong)((quint32)uVar4 + iVar10);
    iVar5 = iVar5 * 2;
    uVar6 = uVar6 - 1;
  }
  return (quint32)uVar4;
}

Assistant:

const T *data() const noexcept { return ptr; }